

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgproc-benchmark.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  WaterEffectOptions *this;
  int iVar1;
  long lVar2;
  ostream *poVar3;
  runtime_error *this_00;
  float fVar4;
  allocator local_b1;
  ProgramOptions po;
  char *end;
  
  ProgramOptions::ProgramOptions(&po);
  if (argc == 1) {
    ProgramOptions::usage(argv);
  }
  do {
    iVar1 = getopt(argc,argv,"hg:menfir:ac");
    switch(iVar1) {
    case 0x61:
      po.water_opts.blur = true;
      po.water_opts.histogram = true;
      po.water_opts.enhance = true;
      po.water_opts.ripple = true;
      po.cuda = true;
      po.test = true;
      break;
    case 0x62:
    case 100:
    case 0x68:
    case 0x6a:
    case 0x6b:
    case 0x6c:
    case 0x6f:
    case 0x70:
    case 0x71:
      goto switchD_0010fd2f_caseD_62;
    case 99:
      po.cuda = true;
      break;
    case 0x65:
      po.water_opts.histogram = true;
      po.water_opts.enhance = true;
      break;
    case 0x66:
      po.water_opts.blur = true;
      po.water_opts.histogram = true;
      po.water_opts.enhance = true;
      po.water_opts.ripple = true;
      break;
    case 0x67:
      lVar2 = strtol(_optarg,&end,10);
      po.water_opts.blur_size = (int)lVar2;
      po.water_opts.blur = true;
      break;
    case 0x69:
      po.water_opts.save_intermediate = true;
      break;
    case 0x6d:
      po.water_opts.histogram = true;
      break;
    case 0x6e:
      po.water_opts.enhance_hist = true;
      break;
    case 0x72:
      fVar4 = strtof(_optarg,&end);
      po.water_opts.ripple_frequency = (float)((long)fVar4 & 0xffffffff);
      po.water_opts.ripple = true;
      break;
    default:
      if (iVar1 != 0x3f) {
        if (iVar1 == -1) {
          if (*argv[(long)argc + -1] == '-') {
            ProgramOptions::usage(argv);
          }
          else {
            std::__cxx11::string::string((string *)&end,argv[(long)argc + -1],&local_b1);
            std::__cxx11::string::operator=((string *)&po,(string *)&end);
            std::__cxx11::string::~string((string *)&end);
            std::__cxx11::string::find_last_of((char *)&po,0x1135e0);
            std::__cxx11::string::substr((ulong)&end,(ulong)&po);
            this = &po.water_opts;
            std::__cxx11::string::operator=((string *)this,(string *)&end);
            std::__cxx11::string::~string((string *)&end);
            std::__cxx11::string::rfind((char)this,0x2e);
            std::__cxx11::string::substr((ulong)&end,(ulong)this);
            std::__cxx11::string::operator=((string *)this,(string *)&end);
            std::__cxx11::string::~string((string *)&end);
          }
          iVar1 = system("mkdir -p output");
          if (iVar1 != 0) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this_00,"Could not create output directory.");
            __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          ProgramOptions::run(&po);
          ProgramOptions::~ProgramOptions(&po);
          return 0;
        }
        goto switchD_0010fd2f_caseD_62;
      }
      if ((_optopt == 0x72) || (_optopt == 0x67)) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Options -g and -r require an argument.");
        std::endl<char,std::char_traits<char>>(poVar3);
switchD_0010fd2f_caseD_62:
        ProgramOptions::usage(argv);
      }
    }
  } while( true );
}

Assistant:

int main(int argc, char *argv[]) {

  ProgramOptions po;

  if (argc == 1) {
    ProgramOptions::usage(argv);
  }

  // Use GNU getopt to parse command line options
  int opt;
  while ((opt = getopt(argc, argv, "hg:menfir:ac")) != -1) {
    switch (opt) {

      case 'h': {
        ProgramOptions::usage(argv);
        break;
      }

      case 'c': {
        po.cuda = true;
        break;
      }

      case 'g': {
        char *end;
        po.water_opts.blur_size = (unsigned int) std::strtol(optarg, &end, 10);
        po.water_opts.blur = true;
        break;
      }

      case 'm':po.water_opts.histogram = true;
        break;

      case 'e': {
        po.water_opts.enhance = true;
        po.water_opts.histogram = true;
        break;
      }

      case 'n':po.water_opts.enhance_hist = true;
        break;

      case 'f': {
        po.water_opts.blur = true;
        po.water_opts.histogram = true;
        po.water_opts.enhance = true;
        po.water_opts.ripple = true;
        break;
      }

      case 'i':po.water_opts.save_intermediate = true;
        break;

      case 'r': {
        char *end;
        po.water_opts.ripple_frequency = (unsigned int) std::strtof(optarg, &end);
        po.water_opts.ripple = true;
        break;
      }

      case 'a': {
        po.water_opts.blur = true;
        po.water_opts.histogram = true;
        po.water_opts.enhance = true;
        po.water_opts.ripple = true;
        po.test = true;
        po.cuda = true;
        break;
      }

      case '?':
        if ((optopt == 'g') || (optopt == 'r')) {
          std::cerr << "Options -g and -r require an argument." << std::endl;
          ProgramOptions::usage(argv);
        }
        break;

      default:ProgramOptions::usage(argv);
        break;
    }
  }

  // Check if last argument is a filename.
  if (argv[argc - 1][0] != '-') {
    // File name is last argument.
    po.input_file = std::string(argv[argc - 1]);
    // Strip any path
    po.water_opts.img_name = po.input_file.substr(po.input_file.find_last_of("\\/") + 1);
    // Strip the extension
    po.water_opts.img_name = po.water_opts.img_name.substr(0, po.water_opts.img_name.find_last_of('.'));
  } else {
    ProgramOptions::usage(argv);
  }

  // Create an output directory, if it doesn't already exist.
  // This only works for cool operating systems.
  if (system("mkdir -p output") != 0) {
    throw std::runtime_error("Could not create output directory.");
  }

  // Run everything
  po.run();

  return 0;
}